

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int udp_ep_get_port(void *arg,void *buf,size_t *szp,nni_type t)

{
  nni_mtx *mtx;
  int iVar1;
  undefined1 local_b8 [8];
  nng_sockaddr sa;
  
  mtx = (nni_mtx *)((long)arg + 8);
  nni_mtx_lock(mtx);
  if (*arg == (nni_plat_udp *)0x0) {
    memcpy(local_b8,(void *)((long)arg + 0x858),0x88);
  }
  else {
    nni_plat_udp_sockname(*arg,(nni_sockaddr *)local_b8);
  }
  if ((ushort)((short)local_b8._0_4_ - 3U) < 2) {
    nni_mtx_unlock(mtx);
    iVar1 = nni_copyout_int((uint)(ushort)(local_b8._2_2_ << 8 | (ushort)local_b8._2_2_ >> 8),buf,
                            szp,t);
  }
  else {
    nni_mtx_unlock(mtx);
    iVar1 = 0xb;
  }
  return iVar1;
}

Assistant:

static int
udp_ep_get_port(void *arg, void *buf, size_t *szp, nni_type t)
{
	udp_ep      *ep = arg;
	nng_sockaddr sa;
	int          port;
	uint8_t     *paddr;

	nni_mtx_lock(&ep->mtx);
	if (ep->udp != NULL) {
		(void) nni_udp_sockname(ep->udp, &sa);
	} else {
		sa = ep->self_sa;
	}
	switch (sa.s_family) {
	case NNG_AF_INET:
		paddr = (void *) &sa.s_in.sa_port;
		break;

	case NNG_AF_INET6:
		paddr = (void *) &sa.s_in6.sa_port;
		break;

	default:
		paddr = NULL;
		break;
	}
	nni_mtx_unlock(&ep->mtx);

	if (paddr == NULL) {
		return (NNG_ESTATE);
	}

	NNI_GET16(paddr, port);
	return (nni_copyout_int(port, buf, szp, t));
}